

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# representation.cpp
# Opt level: O2

int Catch(Situation *situation,Movement *move)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  int player;
  uint uVar13;
  
  bVar1 = move->to;
  uVar5 = (uint)situation->current_board[bVar1] + situation->current_player * -0x10;
  if (uVar5 < 0x1b) {
    player = 1 - situation->current_player;
    uVar13 = player * 0x10 + 0x10;
    if ((0x600000U >> (uVar5 & 0x1f) & 1) == 0) {
      uVar10 = bVar1 & 0xf;
      uVar11 = (uint)(bVar1 >> 4);
      uVar8 = (uint)bVar1;
      if ((0x1800000U >> (uVar5 & 0x1f) & 1) == 0) {
        if ((0x6000000U >> (uVar5 & 0x1f) & 1) == 0) {
          return 0;
        }
        if (uVar10 == (move->from & 0xf)) {
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            bVar1 = *(byte *)(lVar12 + (ulong)situation->bit_row[uVar11] * 8 +
                                       (ulong)((uVar8 & 0xf) << 0xc) + 0x304d44);
            if (uVar10 != bVar1) {
              uVar9 = (ulong)bVar1 | (ulong)(uVar8 & 0xfffffff0);
              bVar2 = situation->current_board[uVar9];
              if ((uVar13 & bVar2) != 0) {
                uVar5 = bVar2 - uVar13;
                if (uVar5 == 0) {
                  return uVar13;
                }
                if ((int)uVar5 < 9) {
                  if (1 < uVar5 - 5) {
                    return (uint)bVar2;
                  }
                }
                else if ((uVar5 < 0xb) ||
                        ((((uint)bVar1 | uVar8 & 0xfffffff0) & 0xffffff80) != player * 0x80))
                goto LAB_0010918b;
                bVar4 = IfProtected(player,(int)uVar9,situation,0);
                if (!bVar4) {
                  return (uint)bVar2;
                }
              }
            }
LAB_0010918b:
          }
        }
        else {
          for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
            bVar2 = *(byte *)(lVar12 + (ulong)((bVar1 & 0xf0) << 9) + 0x30ad44 +
                                       (ulong)situation->bit_col[uVar10] * 8);
            if (uVar11 != bVar2) {
              uVar5 = (uint)bVar2 * 0x10;
              uVar8 = uVar5 + uVar10;
              bVar2 = situation->current_board[uVar8];
              if ((uVar13 & bVar2) != 0) {
                uVar7 = bVar2 - uVar13;
                if (uVar7 == 0) {
                  return uVar13;
                }
                if ((int)uVar7 < 9) {
                  if (1 < uVar7 - 5) {
                    return (uint)bVar2;
                  }
                }
                else if ((uVar7 < 0xb) || ((uVar5 & 0x80) != player * 0x80)) goto LAB_00109448;
                bVar4 = IfProtected(player,uVar8,situation,0);
                if (!bVar4) {
                  return (uint)bVar2;
                }
              }
            }
LAB_00109448:
          }
        }
      }
      else if (uVar10 == (move->from & 0xf)) {
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          bVar2 = *(byte *)(lVar12 + (ulong)((bVar1 & 0xf) << 0xc) + 0x304d42 +
                                     (ulong)situation->bit_row[uVar11] * 8);
          if (uVar10 != bVar2) {
            uVar9 = (ulong)bVar2 | (ulong)(uVar8 & 0xfffffff0);
            bVar3 = situation->current_board[uVar9];
            uVar5 = (uint)bVar3;
            if ((uVar13 & uVar5) != 0) {
              uVar7 = uVar5 - uVar13;
              if (uVar5 == uVar13) {
                return uVar13;
              }
              if ((int)uVar7 < 8) {
                if (uVar7 != 7 && 4 < (int)uVar7) {
LAB_00109238:
                  bVar4 = IfProtected(player,(int)uVar9,situation,0);
                  if (!bVar4) {
                    return (uint)bVar3;
                  }
                }
              }
              else if ((uVar7 < 0xb) ||
                      ((((uint)bVar2 | uVar8 & 0xfffffff0) & 0xffffff80) == player * 0x80))
              goto LAB_00109238;
            }
          }
        }
      }
      else {
        for (lVar12 = 0; lVar12 != 2; lVar12 = lVar12 + 1) {
          bVar2 = *(byte *)(lVar12 + (ulong)((bVar1 & 0xf0) << 9) + 0x30ad42 +
                                     (ulong)situation->bit_col[uVar10] * 8);
          if (uVar11 != bVar2) {
            uVar5 = (uint)bVar2 * 0x10;
            uVar8 = uVar5 + uVar10;
            bVar2 = situation->current_board[uVar8];
            uVar7 = (uint)bVar2;
            if ((uVar13 & uVar7) != 0) {
              uVar6 = uVar7 - uVar13;
              if (uVar7 == uVar13) {
                return uVar13;
              }
              if ((int)uVar6 < 8) {
                if (uVar6 != 7 && 4 < (int)uVar6) {
LAB_00109380:
                  bVar4 = IfProtected(player,uVar8,situation,0);
                  if (!bVar4) {
                    return (uint)bVar2;
                  }
                }
              }
              else if ((uVar6 < 0xb) || ((uVar5 & 0x80) == player * 0x80)) goto LAB_00109380;
            }
          }
        }
      }
    }
    else {
      lVar12 = (ulong)bVar1 * 0x28;
      while( true ) {
        uVar5 = *(uint *)((long)HORSE_CAN_GET[0] + lVar12);
        if ((long)(int)uVar5 == 0) break;
        if (situation->current_board[*(int *)((long)HORSE_LEG[0] + lVar12)] == '\0') {
          bVar1 = situation->current_board[(int)uVar5];
          uVar8 = (uint)bVar1;
          if ((uVar13 & uVar8) != 0) {
            uVar10 = uVar8 - uVar13;
            if (uVar8 == uVar13) {
              return uVar13;
            }
            if ((int)uVar10 < 9) {
              if (6 < (int)uVar10) {
                return (uint)bVar1;
              }
            }
            else if (((uVar10 < 0xb) || ((uVar5 & 0x80) == player * 0x80)) &&
                    (bVar4 = IfProtected(player,uVar5,situation,0), !bVar4)) {
              return (uint)bVar1;
            }
          }
        }
        lVar12 = lVar12 + 4;
      }
    }
  }
  return 0;
}

Assistant:

int Catch(const Situation & situation, const Movement & move){
    int player_flag, opplayer_flag, from, to, from_id, catch_id, counter;
    player_flag = GetPlayerFlag(situation.current_player);
    opplayer_flag = GetPlayerFlag(OpponentPlayer(situation.current_player));
    from = move.to;
    from_id = situation.current_board[from];
    int horse_leg;
    int from_col = GetCol(from), from_row = GetRow(from);

    switch (from_id - player_flag){
    // 马抓子
    case 5:
    case 6:
        counter = 0;
        to = HORSE_CAN_GET[from][counter];
        while(to != 0){
            horse_leg = HORSE_LEG[from][counter];
            catch_id = situation.current_board[to];
            if(situation.current_board[horse_leg] == 0 && (catch_id & opplayer_flag) != 0){
                int catch_id_no = catch_id - opplayer_flag;
                if(catch_id_no == 0) return catch_id;
                if(catch_id_no <= 8){
                    if(catch_id_no >= 7) return catch_id;
                }
                else if(catch_id_no <= 10){
                    if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
                else{
                    if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                }
            }
            counter ++;
            to = HORSE_CAN_GET[from][counter];
        }
        break;
    // 车抓子
    case 7:
    case 8:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].rook_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].rook_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 7){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                        }
                        else if(catch_id_no <= 10){
                            if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                        else{
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    // 炮抓子
    case 9:
    case 10:
        // 纵向移动
        if(from_col == GetCol(move.from)){
            for(int i = 0; i < 2; i ++){
                int catch_col = ROOK_CANNON_CAN_GET_ROW[from_col - 3][situation.bit_row[from_row]].cannon_capture[i];
                if(catch_col != from_col){
                    to = GetPosition(catch_col, from_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        // 横向移动
        else{
            for(int i = 0;i < 2; i ++){
                int catch_row = ROOK_CANNON_CAN_GET_COL[from_row - 3][situation.bit_col[from_col]].cannon_capture[i];
                if(catch_row != from_row){
                    to = GetPosition(from_col, catch_row);
                    catch_id = situation.current_board[to];
                    if((catch_id & opplayer_flag) != 0){
                        int catch_id_no = catch_id - opplayer_flag;
                        if(catch_id_no == 0) return catch_id;
                        if(catch_id_no <= 8){
                            if(catch_id_no >= 5 && catch_id_no <= 6){
                                if(!IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                            }
                            else return catch_id;
                        }
                        else if(catch_id_no >= 11){
                            if(!InHomeHalf(to, OpponentPlayer(situation.current_player)) && !IfProtected(OpponentPlayer(situation.current_player), to, situation)) return catch_id;
                        }
                    }
                }
            }
        }
        break;
    default:
        break;
    }
    return 0;
}